

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void make_main_window(void)

{
  Fl_Window *this;
  Fl_Widget *this_00;
  Fl_Menu_ *this_01;
  
  if (batch_mode == 0) {
    Fl_Preferences::get(&fluid_prefs,"snap",&snap,1);
    Fl_Preferences::get(&fluid_prefs,"gridx",&gridx,5);
    Fl_Preferences::get(&fluid_prefs,"gridy",&gridy,5);
    Fl_Preferences::get(&fluid_prefs,"show_guides",&show_guides,0);
    Fl_Preferences::get(&fluid_prefs,"widget_size",&Fl_Widget_Type::default_size,0xe);
    Fl_Preferences::get(&fluid_prefs,"show_comments",&show_comments,1);
    make_layout_window();
    make_shell_window();
  }
  if (main_window == (Fl_Window *)0x0) {
    this = (Fl_Window *)operator_new(0xf0);
    Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this,300,0x20d,"fluid");
    main_window = this;
    (this->super_Fl_Group).super_Fl_Widget.box_ = '\0';
    this_00 = make_widget_browser(0,0x19,300,500);
    this_00->box_ = '\x01';
    Fl_Widget::tooltip(this_00,"Double-click to view or change an item.");
    (main_window->super_Fl_Group).resizable_ = this_00;
    this_01 = (Fl_Menu_ *)operator_new(0x98);
    Fl_Menu_Bar::Fl_Menu_Bar((Fl_Menu_Bar *)this_01,0,0,300,0x19,(char *)0x0);
    main_menubar = (Fl_Menu_Bar *)this_01;
    Fl_Menu_::menu(this_01,Main_Menu);
    save_item = Fl_Menu_::find_item(&main_menubar->super_Fl_Menu_,save_cb);
    history_item = Fl_Menu_::find_item(&main_menubar->super_Fl_Menu_,open_history_cb);
    widgetbin_item = Fl_Menu_::find_item(&main_menubar->super_Fl_Menu_,toggle_widgetbin_cb);
    sourceview_item = Fl_Menu_::find_item(&main_menubar->super_Fl_Menu_,toggle_sourceview_cb);
    Fl_Menu_::global(&main_menubar->super_Fl_Menu_);
    fill_in_New_Menu();
    Fl_Group::end(&main_window->super_Fl_Group);
  }
  if (batch_mode != 0) {
    return;
  }
  load_history();
  make_settings_window();
  make_global_settings_window();
  return;
}

Assistant:

void make_main_window() {
  if (!batch_mode) {
    fluid_prefs.get("snap", snap, 1);
    fluid_prefs.get("gridx", gridx, 5);
    fluid_prefs.get("gridy", gridy, 5);
    fluid_prefs.get("show_guides", show_guides, 0);
    fluid_prefs.get("widget_size", Fl_Widget_Type::default_size, 14);
    fluid_prefs.get("show_comments", show_comments, 1);
    make_layout_window();
    make_shell_window();
  }

  if (!main_window) {
    Fl_Widget *o;
    main_window = new Fl_Double_Window(WINWIDTH,WINHEIGHT,"fluid");
    main_window->box(FL_NO_BOX);
    o = make_widget_browser(0,MENUHEIGHT,BROWSERWIDTH,BROWSERHEIGHT);
    o->box(FL_FLAT_BOX);
    o->tooltip("Double-click to view or change an item.");
    main_window->resizable(o);
    main_menubar = new Fl_Menu_Bar(0,0,BROWSERWIDTH,MENUHEIGHT);
    main_menubar->menu(Main_Menu);
    // quick access to all dynamic menu items
    save_item = (Fl_Menu_Item*)main_menubar->find_item(save_cb);
    history_item = (Fl_Menu_Item*)main_menubar->find_item(open_history_cb);
    widgetbin_item = (Fl_Menu_Item*)main_menubar->find_item(toggle_widgetbin_cb);
    sourceview_item = (Fl_Menu_Item*)main_menubar->find_item((Fl_Callback*)toggle_sourceview_cb);
    main_menubar->global();
    fill_in_New_Menu();
    main_window->end();
  }

  if (!batch_mode) {
    load_history();
    make_settings_window();
    make_global_settings_window();
  }
}